

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O3

c_int osqp_cleanup(OSQPWorkspace *work)

{
  LinSysSolver *pLVar1;
  c_int cVar2;
  OSQPData *__ptr;
  OSQPScaling *__ptr_00;
  OSQPPolish *__ptr_01;
  OSQPSolution *__ptr_02;
  
  if (work == (OSQPWorkspace *)0x0) {
    cVar2 = 0;
  }
  else {
    __ptr = work->data;
    if (__ptr != (OSQPData *)0x0) {
      if (__ptr->P != (csc *)0x0) {
        csc_spfree(__ptr->P);
        __ptr = work->data;
      }
      if (__ptr->A != (csc *)0x0) {
        csc_spfree(__ptr->A);
        __ptr = work->data;
      }
      if (__ptr->q != (c_float *)0x0) {
        free(__ptr->q);
        __ptr = work->data;
      }
      if (__ptr->l != (c_float *)0x0) {
        free(__ptr->l);
        __ptr = work->data;
      }
      if (__ptr->u != (c_float *)0x0) {
        free(__ptr->u);
        __ptr = work->data;
      }
      free(__ptr);
    }
    __ptr_00 = work->scaling;
    if (__ptr_00 != (OSQPScaling *)0x0) {
      if (__ptr_00->D != (c_float *)0x0) {
        free(__ptr_00->D);
        __ptr_00 = work->scaling;
      }
      if (__ptr_00->Dinv != (c_float *)0x0) {
        free(__ptr_00->Dinv);
        __ptr_00 = work->scaling;
      }
      if (__ptr_00->E != (c_float *)0x0) {
        free(__ptr_00->E);
        __ptr_00 = work->scaling;
      }
      if (__ptr_00->Einv != (c_float *)0x0) {
        free(__ptr_00->Einv);
        __ptr_00 = work->scaling;
      }
      free(__ptr_00);
    }
    if (work->D_temp != (c_float *)0x0) {
      free(work->D_temp);
    }
    if (work->D_temp_A != (c_float *)0x0) {
      free(work->D_temp_A);
    }
    if (work->E_temp != (c_float *)0x0) {
      free(work->E_temp);
    }
    pLVar1 = work->linsys_solver;
    if ((pLVar1 != (LinSysSolver *)0x0) && (pLVar1->free != (_func_void_LinSysSolver_ptr *)0x0)) {
      (*pLVar1->free)(pLVar1);
    }
    if (work->settings == (OSQPSettings *)0x0) {
      cVar2 = 0;
    }
    else {
      cVar2 = unload_linsys_solver(work->settings->linsys_solver);
    }
    __ptr_01 = work->pol;
    if (__ptr_01 != (OSQPPolish *)0x0) {
      if (__ptr_01->Alow_to_A != (c_int *)0x0) {
        free(__ptr_01->Alow_to_A);
        __ptr_01 = work->pol;
      }
      if (__ptr_01->Aupp_to_A != (c_int *)0x0) {
        free(__ptr_01->Aupp_to_A);
        __ptr_01 = work->pol;
      }
      if (__ptr_01->A_to_Alow != (c_int *)0x0) {
        free(__ptr_01->A_to_Alow);
        __ptr_01 = work->pol;
      }
      if (__ptr_01->A_to_Aupp != (c_int *)0x0) {
        free(__ptr_01->A_to_Aupp);
        __ptr_01 = work->pol;
      }
      if (__ptr_01->x != (c_float *)0x0) {
        free(__ptr_01->x);
        __ptr_01 = work->pol;
      }
      if (__ptr_01->z != (c_float *)0x0) {
        free(__ptr_01->z);
        __ptr_01 = work->pol;
      }
      if (__ptr_01->y != (c_float *)0x0) {
        free(__ptr_01->y);
        __ptr_01 = work->pol;
      }
      free(__ptr_01);
    }
    if (work->rho_vec != (c_float *)0x0) {
      free(work->rho_vec);
    }
    if (work->rho_inv_vec != (c_float *)0x0) {
      free(work->rho_inv_vec);
    }
    if (work->constr_type != (c_int *)0x0) {
      free(work->constr_type);
    }
    if (work->x != (c_float *)0x0) {
      free(work->x);
    }
    if (work->z != (c_float *)0x0) {
      free(work->z);
    }
    if (work->xz_tilde != (c_float *)0x0) {
      free(work->xz_tilde);
    }
    if (work->x_prev != (c_float *)0x0) {
      free(work->x_prev);
    }
    if (work->z_prev != (c_float *)0x0) {
      free(work->z_prev);
    }
    if (work->y != (c_float *)0x0) {
      free(work->y);
    }
    if (work->Ax != (c_float *)0x0) {
      free(work->Ax);
    }
    if (work->Px != (c_float *)0x0) {
      free(work->Px);
    }
    if (work->Aty != (c_float *)0x0) {
      free(work->Aty);
    }
    if (work->delta_y != (c_float *)0x0) {
      free(work->delta_y);
    }
    if (work->Atdelta_y != (c_float *)0x0) {
      free(work->Atdelta_y);
    }
    if (work->delta_x != (c_float *)0x0) {
      free(work->delta_x);
    }
    if (work->Pdelta_x != (c_float *)0x0) {
      free(work->Pdelta_x);
    }
    if (work->Adelta_x != (c_float *)0x0) {
      free(work->Adelta_x);
    }
    if (work->settings != (OSQPSettings *)0x0) {
      free(work->settings);
    }
    __ptr_02 = work->solution;
    if (__ptr_02 != (OSQPSolution *)0x0) {
      if (__ptr_02->x != (c_float *)0x0) {
        free(__ptr_02->x);
        __ptr_02 = work->solution;
      }
      if (__ptr_02->y != (c_float *)0x0) {
        free(__ptr_02->y);
        __ptr_02 = work->solution;
      }
      free(__ptr_02);
    }
    if (work->info != (OSQPInfo *)0x0) {
      free(work->info);
    }
    if (work->timer != (OSQPTimer *)0x0) {
      free(work->timer);
    }
    free(work);
  }
  return cVar2;
}

Assistant:

c_int osqp_cleanup(OSQPWorkspace *work) {
  c_int exitflag = 0;

  if (work) { // If workspace has been allocated
    // Free Data
    if (work->data) {
      if (work->data->P) csc_spfree(work->data->P);
      if (work->data->A) csc_spfree(work->data->A);
      if (work->data->q) c_free(work->data->q);
      if (work->data->l) c_free(work->data->l);
      if (work->data->u) c_free(work->data->u);
      c_free(work->data);
    }

    // Free scaling variables
    if (work->scaling){
      if (work->scaling->D)    c_free(work->scaling->D);
      if (work->scaling->Dinv) c_free(work->scaling->Dinv);
      if (work->scaling->E)    c_free(work->scaling->E);
      if (work->scaling->Einv) c_free(work->scaling->Einv);
      c_free(work->scaling);
    }

    // Free temp workspace variables for scaling
    if (work->D_temp)   c_free(work->D_temp);
    if (work->D_temp_A) c_free(work->D_temp_A);
    if (work->E_temp)   c_free(work->E_temp);

    // Free linear system solver structure
    if (work->linsys_solver) {
      if (work->linsys_solver->free) {
        work->linsys_solver->free(work->linsys_solver);
      }
    }

    // Unload linear system solver after free
    if (work->settings) {
      exitflag = unload_linsys_solver(work->settings->linsys_solver);
    }

#ifndef EMBEDDED
    // Free active constraints structure
    if (work->pol) {
      if (work->pol->Alow_to_A) c_free(work->pol->Alow_to_A);
      if (work->pol->Aupp_to_A) c_free(work->pol->Aupp_to_A);
      if (work->pol->A_to_Alow) c_free(work->pol->A_to_Alow);
      if (work->pol->A_to_Aupp) c_free(work->pol->A_to_Aupp);
      if (work->pol->x)         c_free(work->pol->x);
      if (work->pol->z)         c_free(work->pol->z);
      if (work->pol->y)         c_free(work->pol->y);
      c_free(work->pol);
    }
#endif /* ifndef EMBEDDED */

    // Free other Variables
    if (work->rho_vec)     c_free(work->rho_vec);
    if (work->rho_inv_vec) c_free(work->rho_inv_vec);
#if EMBEDDED != 1
    if (work->constr_type) c_free(work->constr_type);
#endif
    if (work->x)           c_free(work->x);
    if (work->z)           c_free(work->z);
    if (work->xz_tilde)    c_free(work->xz_tilde);
    if (work->x_prev)      c_free(work->x_prev);
    if (work->z_prev)      c_free(work->z_prev);
    if (work->y)           c_free(work->y);
    if (work->Ax)          c_free(work->Ax);
    if (work->Px)          c_free(work->Px);
    if (work->Aty)         c_free(work->Aty);
    if (work->delta_y)     c_free(work->delta_y);
    if (work->Atdelta_y)   c_free(work->Atdelta_y);
    if (work->delta_x)     c_free(work->delta_x);
    if (work->Pdelta_x)    c_free(work->Pdelta_x);
    if (work->Adelta_x)    c_free(work->Adelta_x);

    // Free Settings
    if (work->settings) c_free(work->settings);

    // Free solution
    if (work->solution) {
      if (work->solution->x) c_free(work->solution->x);
      if (work->solution->y) c_free(work->solution->y);
      c_free(work->solution);
    }

    // Free information
    if (work->info) c_free(work->info);

# ifdef PROFILING
    // Free timer
    if (work->timer) c_free(work->timer);
# endif /* ifdef PROFILING */

    // Free work
    c_free(work);
  }

  return exitflag;
}